

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.cpp
# Opt level: O3

size_t pstore::utf::length(char *str,size_t nbytes)

{
  size_t sVar1;
  size_t sVar2;
  
  if ((str != (char *)0x0) && (nbytes != 0)) {
    sVar2 = 0;
    sVar1 = 0;
    do {
      sVar1 = sVar1 + 1;
      sVar2 = sVar2 + 1;
    } while (nbytes != sVar2);
    return sVar1;
  }
  return 0;
}

Assistant:

auto length (char const * const str, std::size_t const nbytes) -> std::size_t {
            return str == nullptr ? 0 : length (str, str + nbytes);
        }